

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O1

void __thiscall
cfgfile::lexical_analyzer_t<cfgfile::qstring_trait_t>::skip_multi_line_comment
          (lexical_analyzer_t<cfgfile::qstring_trait_t> *this)

{
  input_stream_t<cfgfile::qstring_trait_t> *piVar1;
  char cVar2;
  char_t cVar3;
  char_t cVar4;
  bool bVar5;
  
  piVar1 = this->m_stream;
  if ((((piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        (piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) && (cVar2 = QTextStream::atEnd(), cVar2 != '\0')) &&
     (piVar1->m_buf_pos == (piVar1->m_buf).d.size)) {
    return;
  }
  cVar3 = input_stream_t<cfgfile::qstring_trait_t>::get(this->m_stream);
  piVar1 = this->m_stream;
  if ((((piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        (piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) && (cVar2 = QTextStream::atEnd(), cVar2 != '\0')) &&
     (piVar1->m_buf_pos == (piVar1->m_buf).d.size)) {
    return;
  }
  cVar4 = input_stream_t<cfgfile::qstring_trait_t>::get(this->m_stream);
  if ((cVar3.ucs != const_t<cfgfile::qstring_trait_t>::c_sharp) ||
     (cVar4.ucs != const_t<cfgfile::qstring_trait_t>::c_vertical_bar)) {
    do {
      piVar1 = this->m_stream;
      if (((piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur ==
           (piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur) &&
         ((cVar2 = QTextStream::atEnd(), cVar2 != '\0' &&
          (piVar1->m_buf_pos == (piVar1->m_buf).d.size)))) {
        return;
      }
      cVar3 = input_stream_t<cfgfile::qstring_trait_t>::get(this->m_stream);
      bVar5 = cVar4.ucs != const_t<cfgfile::qstring_trait_t>::c_sharp;
      cVar4 = cVar3;
    } while ((bVar5) || (cVar3.ucs != const_t<cfgfile::qstring_trait_t>::c_vertical_bar));
  }
  return;
}

Assistant:

void skip_multi_line_comment()
	{
		if( !m_stream.at_end() )
		{
			typename Trait::char_t ch = m_stream.get();

			if( m_stream.at_end() )
				return;

			typename Trait::char_t next_char = m_stream.get();

			if( ch == const_t< Trait >::c_sharp &&
				next_char == const_t< Trait >::c_vertical_bar )
					return;

			while( !m_stream.at_end() )
			{
				ch = next_char;

				next_char = m_stream.get();

				if( ch == const_t< Trait >::c_sharp &&
					next_char == const_t< Trait >::c_vertical_bar )
						break;
			}
		}
	}